

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testEnvironment(void)

{
  char *pcVar1;
  int testSigned;
  long distance;
  char *s;
  int sizeOfWord;
  int nrTests;
  
  pcVar1 = strstr("1234567890","0");
  printf("sizeof(char)=%ld, sizeof(UWORD)=%ld, sizeof(int)=%ld, sizeof(long int)=%ld char=%s\n",1,2,
         4,8,"signed");
  if (pcVar1 + -0x229edf != (char *)0x9) {
    foundError();
    printf("*** ERROR *** Incompatible system, char* math does not work as expected, distance=%ld\n"
           ,pcVar1 + -0x229edf);
  }
  return 2;
}

Assistant:

static int testEnvironment(void) {
    int nrTests = 0;
    int sizeOfWord = sizeof(UWORD);
    char *s = "1234567890";
    long distance = (strstr(s, "0") - s);

    int testSigned = (int) ((char) -1);
    printf("sizeof(char)=%ld, sizeof(UWORD)=%ld, sizeof(int)=%ld, sizeof(long int)=%ld char=%s\n",
           sizeof(char), sizeof(UWORD), sizeof(int), sizeof(long int), (testSigned == -1) ? "signed" : "unsigned");

    // Check size of UWORD.
    nrTests++;
    if (sizeOfWord != 2) {
        foundError();
        printf("*** ERROR *** Incompatible system, UWORD is not 2 bytes, but %d\n", (int) sizeof(UWORD));
    }

    // Check char* math.
    nrTests++;
    if (distance != 9) {
        foundError();
        printf("*** ERROR *** Incompatible system, char* math does not work as expected, distance=%ld\n", distance);
    }
    return nrTests;
}